

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::ComparisonTest_IgnoredAddTest_Test::TestBody
          (ComparisonTest_IgnoredAddTest_Test *this)

{
  byte *pbVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Arena *arena;
  pointer *__ptr;
  char *message;
  string_view value;
  AssertionResult gtest_ar;
  string local_58;
  AssertHelper local_38;
  internal local_30 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  
  (this->super_ComparisonTest).proto2diff_.field_0._impl_.v_ = 3;
  pbVar1 = (byte *)((long)&(this->super_ComparisonTest).proto2diff_.field_0 + 0x18);
  *pbVar1 = *pbVar1 | 5;
  arena = (Arena *)(this->super_ComparisonTest).proto2diff_.super_Message.super_MessageLite.
                   _internal_metadata_.ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  value._M_str = "foo";
  value._M_len = 3;
  protobuf::internal::ArenaStringPtr::Set
            (&(this->super_ComparisonTest).proto2diff_.field_0._impl_.w_,value,arena);
  paVar2 = &local_58.field_2;
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"v","");
  std::__cxx11::string::_M_assign((string *)&(this->super_ComparisonTest).ignored_field_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  protobuf::(anonymous_namespace)::ComparisonTest::Run_abi_cxx11_
            (&local_58,this,&(this->super_ComparisonTest).proto1diff_.super_Message,
             &(this->super_ComparisonTest).proto2diff_.super_Message);
  testing::internal::CmpHelperEQ<char[28],std::__cxx11::string>
            (local_30,"\"ignored: v\\n\" \"added: w: \\\"foo\\\"\\n\"","RunDiff()",
             (char (*) [28])"ignored: v\nadded: w: \"foo\"\n",&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_28 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = anon_var_dwarf_a12c75 + 5;
    }
    else {
      message = (local_28->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0xdf5,message);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_58._M_dataplus._M_p + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  return;
}

Assistant:

TEST_F(ComparisonTest, IgnoredAddTest) {
  proto2diff_.set_v(3);
  proto2diff_.set_w("foo");

  ignore_field("v");

  EXPECT_EQ(
      "ignored: v\n"
      "added: w: \"foo\"\n",
      RunDiff());
}